

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alpha_processing.c
# Opt level: O1

void WebPMultARGBRow_C(uint32_t *ptr,int width,int inverse)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  uint32_t uVar4;
  
  if (0 < width) {
    uVar3 = 0;
    do {
      uVar1 = ptr[uVar3];
      if (uVar1 < 0xff000000) {
        uVar4 = 0;
        if (0xffffff < uVar1) {
          if (inverse == 0) {
            iVar2 = (uVar1 >> 0x18) * 0x10101;
          }
          else {
            iVar2 = (int)(0xff000000 / (ulong)(uVar1 >> 0x18));
          }
          uVar4 = (uVar1 >> 0x10 & 0xff) * iVar2 + 0x800000 >> 8 & 0xff0000 |
                  (uVar1 >> 8 & 0xff) * iVar2 + 0x800000 >> 0x10 & 0xff00 |
                  (uVar1 & 0xff) * iVar2 + 0x800000 >> 0x18 | uVar1 & 0xff000000;
        }
        ptr[uVar3] = uVar4;
      }
      uVar3 = uVar3 + 1;
    } while ((uint)width != uVar3);
  }
  return;
}

Assistant:

void WebPMultARGBRow_C(uint32_t* const ptr, int width, int inverse) {
  int x;
  for (x = 0; x < width; ++x) {
    const uint32_t argb = ptr[x];
    if (argb < 0xff000000u) {      // alpha < 255
      if (argb <= 0x00ffffffu) {   // alpha == 0
        ptr[x] = 0;
      } else {
        const uint32_t alpha = (argb >> 24) & 0xff;
        const uint32_t scale = GetScale(alpha, inverse);
        uint32_t out = argb & 0xff000000u;
        out |= Mult(argb >>  0, scale) <<  0;
        out |= Mult(argb >>  8, scale) <<  8;
        out |= Mult(argb >> 16, scale) << 16;
        ptr[x] = out;
      }
    }
  }
}